

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O1

void __thiscall ParseOperation::ParseOperation(ParseOperation *this,Production *reduceProduction)

{
  int iVar1;
  string *psVar2;
  
  this->reduceProduction = reduceProduction;
  this->newState = (GLRState *)0x0;
  psVar2 = Production::getFromP_abi_cxx11_(reduceProduction);
  iVar1 = std::__cxx11::string::compare((char *)psVar2);
  this->operationType = (iVar1 == 0) + reduce;
  return;
}

Assistant:

ParseOperation::ParseOperation(Production *reduceProduction) : reduceProduction(
        reduceProduction) {
    if (reduceProduction->getFromP() == "accept") {
        operationType = accept;
    } else {
        operationType = reduce;
    }
}